

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.hpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerGLSL::
statement_inner<char_const(&)[5],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[2]>
          (CompilerGLSL *this,char (*t) [5],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts,char (*ts_1) [2],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_2,char (*ts_3) [3],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_4,char (*ts_5) [2])

{
  StringStream<4096UL,_4096UL> *this_00;
  size_t sVar1;
  
  this_00 = &this->buffer;
  sVar1 = strlen(*t);
  StringStream<4096UL,_4096UL>::append(this_00,*t,sVar1);
  this->statement_count = this->statement_count + 1;
  StringStream<4096UL,_4096UL>::append(this_00,(ts->_M_dataplus)._M_p,ts->_M_string_length);
  this->statement_count = this->statement_count + 1;
  sVar1 = strlen(*ts_1);
  StringStream<4096UL,_4096UL>::append(this_00,*ts_1,sVar1);
  this->statement_count = this->statement_count + 1;
  StringStream<4096UL,_4096UL>::append(this_00,(ts_2->_M_dataplus)._M_p,ts_2->_M_string_length);
  this->statement_count = this->statement_count + 1;
  sVar1 = strlen(*ts_3);
  StringStream<4096UL,_4096UL>::append(this_00,*ts_3,sVar1);
  this->statement_count = this->statement_count + 1;
  StringStream<4096UL,_4096UL>::append(this_00,(ts_4->_M_dataplus)._M_p,ts_4->_M_string_length);
  this->statement_count = this->statement_count + 1;
  sVar1 = strlen(*ts_5);
  StringStream<4096UL,_4096UL>::append(this_00,*ts_5,sVar1);
  this->statement_count = this->statement_count + 1;
  return;
}

Assistant:

inline void statement_inner(T &&t, Ts &&... ts)
	{
		buffer << std::forward<T>(t);
		statement_count++;
		statement_inner(std::forward<Ts>(ts)...);
	}